

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bxdfs.cpp
# Opt level: O2

void __thiscall
pbrt::HairBxDF::HairBxDF
          (HairBxDF *this,Float h,Float eta,SampledSpectrum *sigma_a,Float beta_m,Float beta_n,
          Float alpha)

{
  float fVar1;
  undefined8 uVar2;
  undefined1 auVar3 [16];
  int line;
  long lVar4;
  char *args;
  undefined1 auVar5 [16];
  float fVar6;
  undefined4 in_XMM0_Db;
  undefined4 in_XMM0_Dc;
  undefined4 in_XMM0_Dd;
  float fVar7;
  undefined1 auVar8 [64];
  undefined1 auVar9 [16];
  
  this->h = h;
  fVar6 = SafeASin(h);
  this->gamma_o = fVar6;
  this->eta = eta;
  uVar2 = *(undefined8 *)((sigma_a->values).values + 2);
  *(undefined8 *)(this->sigma_a).values.values = *(undefined8 *)(sigma_a->values).values;
  *(undefined8 *)((this->sigma_a).values.values + 2) = uVar2;
  auVar3._4_4_ = in_XMM0_Db;
  auVar3._0_4_ = h;
  auVar3._8_4_ = in_XMM0_Dc;
  auVar3._12_4_ = in_XMM0_Dd;
  this->beta_m = beta_m;
  this->beta_n = beta_n;
  auVar5._8_4_ = 0x7fffffff;
  auVar5._0_8_ = 0x7fffffff7fffffff;
  auVar5._12_4_ = 0x7fffffff;
  auVar5 = vandps_avx512vl(auVar3,auVar5);
  if (1.0 < auVar5._0_4_) {
    LogFatal<char_const(&)[18]>
              (Fatal,
               "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/bxdfs.cpp"
               ,0x62,"Check failed: %s",(char (*) [18])"h >= -1 && h <= 1");
  }
  if ((beta_m < 0.0) || (1.0 < beta_m)) {
    args = "beta_m >= 0 && beta_m <= 1";
    line = 99;
  }
  else {
    if ((0.0 <= beta_n) && (beta_n <= 1.0)) {
      fVar6 = beta_m * beta_m;
      auVar5 = vfmadd231ss_fma(ZEXT416((uint)(fVar6 * 0.812)),ZEXT416((uint)beta_m),
                               ZEXT416(0x3f39db23));
      fVar6 = fVar6 * fVar6 * beta_m;
      fVar6 = fVar6 * fVar6;
      auVar5 = vfmadd132ss_fma(ZEXT416((uint)(fVar6 * fVar6)),auVar5,ZEXT416(0x406ccccd));
      fVar6 = auVar5._0_4_ * auVar5._0_4_;
      this->v[0] = fVar6;
      this->v[1] = fVar6 * 0.25;
      this->v[2] = fVar6 * 4.0;
      this->v[3] = fVar6 * 4.0;
      fVar6 = beta_n * beta_n;
      auVar5 = vfmadd231ss_fma(ZEXT416((uint)(fVar6 * 1.194)),ZEXT416((uint)beta_n),
                               ZEXT416(0x3e87ae14));
      fVar6 = fVar6 * fVar6 * beta_n;
      fVar6 = fVar6 * fVar6 * beta_n;
      auVar5 = vfmadd132ss_fma(ZEXT416((uint)(fVar6 * fVar6)),auVar5,ZEXT416(0x40abe76d));
      fVar6 = auVar5._0_4_ * 0.62665707;
      this->s = fVar6;
      if (!NAN(fVar6)) {
        fVar6 = sinf(alpha * 0.017453292);
        this->sin2kAlpha[0] = fVar6;
        lVar4 = 0;
        auVar9._0_12_ = ZEXT812(0);
        auVar9._12_4_ = 0;
        auVar5 = vmaxss_avx(ZEXT416((uint)(1.0 - fVar6 * fVar6)),auVar9);
        auVar5 = vsqrtss_avx(auVar5,auVar5);
        auVar8 = ZEXT1664(auVar5);
        this->cos2kAlpha[0] = auVar5._0_4_;
        for (; lVar4 != 2; lVar4 = lVar4 + 1) {
          fVar7 = auVar8._0_4_;
          fVar1 = fVar6 * fVar6;
          fVar6 = (fVar7 + fVar7) * fVar6;
          fVar1 = fVar7 * fVar7 - fVar1;
          auVar8 = ZEXT464((uint)fVar1);
          this->sin2kAlpha[lVar4 + 1] = fVar6;
          this->cos2kAlpha[lVar4 + 1] = fVar1;
        }
        return;
      }
      LogFatal<char_const(&)[10]>
                (Fatal,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/bxdfs.cpp"
                 ,0x72,"Check failed: %s",(char (*) [10])"!IsNaN(s)");
    }
    args = "beta_n >= 0 && beta_n <= 1";
    line = 100;
  }
  LogFatal<char_const(&)[27]>
            (Fatal,
             "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/bxdfs.cpp"
             ,line,"Check failed: %s",(char (*) [27])args);
}

Assistant:

HairBxDF::HairBxDF(Float h, Float eta, const SampledSpectrum &sigma_a, Float beta_m,
                   Float beta_n, Float alpha)
    : h(h),
      gamma_o(SafeASin(h)),
      eta(eta),
      sigma_a(sigma_a),
      beta_m(beta_m),
      beta_n(beta_n) {
    CHECK(h >= -1 && h <= 1);
    CHECK(beta_m >= 0 && beta_m <= 1);
    CHECK(beta_n >= 0 && beta_n <= 1);
    // Compute longitudinal variance from $\beta_m$
    static_assert(pMax >= 3,
                  "Longitudinal variance code must be updated to handle low pMax");
    v[0] = Sqr(0.726f * beta_m + 0.812f * Sqr(beta_m) + 3.7f * Pow<20>(beta_m));
    v[1] = .25 * v[0];
    v[2] = 4 * v[0];
    for (int p = 3; p <= pMax; ++p)
        // TODO: is there anything better here?
        v[p] = v[2];

    // Compute azimuthal logistic scale factor from $\beta_n$
    static const Float SqrtPiOver8 = 0.626657069f;
    s = SqrtPiOver8 * (0.265f * beta_n + 1.194f * Sqr(beta_n) + 5.372f * Pow<22>(beta_n));
    CHECK(!IsNaN(s));

    // Compute $\alpha$ terms for hair scales
    sin2kAlpha[0] = std::sin(Radians(alpha));
    cos2kAlpha[0] = SafeSqrt(1 - Sqr(sin2kAlpha[0]));
    for (int i = 1; i < 3; ++i) {
        sin2kAlpha[i] = 2 * cos2kAlpha[i - 1] * sin2kAlpha[i - 1];
        cos2kAlpha[i] = Sqr(cos2kAlpha[i - 1]) - Sqr(sin2kAlpha[i - 1]);
    }
}